

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O1

void compute_response_layer_unconditional(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  float *pfVar5;
  bool *pbVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  float *pfVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  float *data;
  int iVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  ulong uVar38;
  uint uVar39;
  int iVar40;
  int iVar41;
  float fVar42;
  
  iVar1 = layer->height;
  if (0 < iVar1) {
    pfVar5 = layer->response;
    pbVar6 = layer->laplacian;
    iVar2 = layer->step;
    iVar33 = layer->filter_size;
    uVar3 = layer->width;
    uVar13 = iVar33 / 3;
    fVar42 = 1.0 / (float)(iVar33 * iVar33);
    uVar14 = (iVar33 + -1) - (iVar33 + -1 >> 0x1f) >> 1;
    iVar32 = (iVar33 + -1) - uVar14;
    uVar14 = ~uVar14;
    uVar17 = (ulong)(int)uVar13;
    uVar35 = ~uVar13;
    iVar24 = -uVar13;
    iVar26 = uVar13 - 1;
    iVar40 = iVar26 - iVar33 / 6;
    uVar19 = ~(iVar33 / 6);
    uVar18 = ~uVar17;
    iVar41 = 0;
    iVar37 = -1;
    iVar15 = 0;
    iVar34 = 0;
    iVar33 = iVar32;
    uVar39 = uVar14;
    iVar23 = iVar26;
    uVar31 = uVar13;
    iVar21 = iVar40;
    uVar27 = uVar19;
    do {
      if (0 < (int)uVar3) {
        iVar4 = iimage->data_width;
        iVar16 = iVar4 * uVar31;
        iVar20 = iVar4 * iVar41;
        iVar29 = iVar4 * iVar37;
        iVar30 = iVar4 * uVar35;
        iVar36 = iVar4 * iVar24;
        iVar25 = iVar4 * iVar23;
        pfVar7 = iimage->data;
        iVar22 = 0;
        uVar38 = 0;
        pfVar28 = pfVar7;
        do {
          auVar11 = vfmadd213ss_fma(ZEXT416((uint)((pfVar7[(int)(uVar19 + iVar36 + iVar22)] -
                                                   pfVar7[(int)(uVar19 + iVar25 + iVar22)]) +
                                                  (pfVar7[iVar40 + iVar25 + iVar22] -
                                                  pfVar7[iVar40 + iVar36 + iVar22]))),
                                    SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)((pfVar7[(int)(uVar14 + iVar36 + iVar22)] -
                                                   pfVar7[(int)(uVar14 + iVar25 + iVar22)]) +
                                                  (pfVar7[iVar25 + iVar32 + iVar22] -
                                                  pfVar7[iVar36 + iVar32 + iVar22]))));
          auVar12 = vfmadd213ss_fma(ZEXT416((uint)((pfVar7[iVar4 * iVar21 + iVar26 + iVar22] -
                                                   pfVar7[(int)(iVar4 * uVar27 + iVar26 + iVar22)])
                                                  + (pfVar28[(long)(int)(iVar4 * uVar27) - uVar17] -
                                                    pfVar28[(long)(iVar4 * iVar21) - uVar17]))),
                                    SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)((pfVar7[iVar4 * iVar33 + iVar26 + iVar22] -
                                                   pfVar7[(int)(iVar4 * uVar39 + iVar26 + iVar22)])
                                                  + (pfVar28[(long)(int)(iVar4 * uVar39) - uVar17] -
                                                    pfVar28[(long)(iVar4 * iVar33) - uVar17]))));
          fVar8 = fVar42 * auVar11._0_4_;
          fVar9 = fVar42 * auVar12._0_4_;
          fVar10 = fVar42 * ((((pfVar7[(int)(iVar29 + uVar13 + iVar22)] -
                               pfVar7[(int)(iVar30 + uVar13 + iVar22)]) +
                               (pfVar28[iVar30] - pfVar28[iVar29]) +
                              (pfVar7[iVar16 + -1 + iVar22] - pfVar7[iVar20 + -1 + iVar22]) +
                              (pfVar28[(long)iVar20 + uVar18] - pfVar28[(long)iVar16 + uVar18])) -
                             ((pfVar7[iVar29 + -1 + iVar22] - pfVar7[iVar30 + -1 + iVar22]) +
                             (pfVar28[(long)iVar30 + uVar18] - pfVar28[(long)iVar29 + uVar18]))) -
                            ((pfVar7[(int)(iVar16 + uVar13 + iVar22)] -
                             pfVar7[(int)(uVar13 + iVar20 + iVar22)]) +
                            (pfVar28[iVar20] - pfVar28[iVar16])));
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar10 * -0.81)),ZEXT416((uint)fVar8),
                                    ZEXT416((uint)fVar9));
          pfVar5[(long)iVar15 + uVar38] = auVar11._0_4_;
          pbVar6[uVar38 + (long)iVar15] = 0.0 <= fVar8 + fVar9;
          uVar38 = uVar38 + 1;
          pfVar28 = pfVar28 + iVar2;
          iVar22 = iVar22 + iVar2;
        } while (uVar3 != uVar38);
        iVar15 = iVar15 + (int)uVar38;
      }
      iVar34 = iVar34 + 1;
      uVar31 = uVar31 + iVar2;
      iVar41 = iVar41 + iVar2;
      iVar37 = iVar37 + iVar2;
      uVar35 = uVar35 + iVar2;
      iVar24 = iVar24 + iVar2;
      iVar23 = iVar23 + iVar2;
      iVar21 = iVar21 + iVar2;
      uVar27 = uVar27 + iVar2;
      iVar33 = iVar33 + iVar2;
      uVar39 = uVar39 + iVar2;
    } while (iVar34 != iVar1);
  }
  return;
}

Assistant:

void compute_response_layer_unconditional(struct response_layer *layer, struct integral_image *iimage) {
    /*
    optimizations:
        - uses padded image and therefore box_integral that is completely unconditional
    */
    float Dxx, Dyy, Dxy;
    int x, y;

    float *response = layer->response;
    bool *laplacian = layer->laplacian;

    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size/3;
    int border = (filter_size-1)/2;
    float inv_area = 1.f/(filter_size*filter_size);
    for (int i = 0, ind = 0; i < height; ++i) {
        for (int j = 0; j < width; ++j, ind++) {
            // Image coordinates
            x = i*step;
            y = j*step;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dyy = box_integral_unconditional(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            // response[ind] -= 0.81f * Dxy * Dxy;
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;
            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0);
        }
    }

}